

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhexutils.cpp
# Opt level: O0

bool QHexUtils::PatternUtils::match(QByteArray *data,QString *pattern)

{
  QStringView lhs;
  storage_type_conflict *psVar1;
  bool bVar2;
  char cVar3;
  uint uVar4;
  qsizetype qVar5;
  Type *str;
  bool local_71;
  undefined1 auStack_70 [6];
  char b;
  bool ok;
  qsizetype local_60;
  storage_type_conflict *local_58;
  QStringView local_50;
  undefined1 local_40 [8];
  QStringView hexb;
  qint64 idx;
  qint64 i;
  QString *pattern_local;
  QByteArray *data_local;
  
  idx = 0;
  hexb.m_data = (storage_type_conflict *)0x0;
  while( true ) {
    qVar5 = QString::size(pattern);
    psVar1 = hexb.m_data;
    if (qVar5 + -2 < idx) {
      return true;
    }
    qVar5 = QByteArray::size(data);
    if (qVar5 <= (long)psVar1) break;
    QStringView::QStringView<QString,_true>(&local_50,pattern);
    _local_40 = QStringView::mid(&local_50,idx,2);
    local_60 = (qsizetype)local_40;
    local_58 = (storage_type_conflict *)hexb.m_size;
    str = _GLOBAL__N_1::
          QGlobalStatic<QString,_QHexUtils::PatternUtils::(anonymous_namespace)::Q_QGS_WILDCARD_BYTE::innerFunction,_QHexUtils::PatternUtils::(anonymous_namespace)::Q_QGS_WILDCARD_BYTE::guard>
          ::operator*((QGlobalStatic<QString,_QHexUtils::PatternUtils::(anonymous_namespace)::Q_QGS_WILDCARD_BYTE::innerFunction,_QHexUtils::PatternUtils::(anonymous_namespace)::Q_QGS_WILDCARD_BYTE::guard>
                       *)&WILDCARD_BYTE);
    QStringView::QStringView<QString,_true>((QStringView *)auStack_70,str);
    lhs.m_data = local_58;
    lhs.m_size = local_60;
    bVar2 = ::operator==(lhs,_auStack_70);
    if (!bVar2) {
      local_71 = false;
      uVar4 = QStringView::toUInt((QStringView *)local_40,&local_71,0x10);
      if (((local_71 & 1U) == 0) ||
         (cVar3 = QByteArray::at(data,(qsizetype)hexb.m_data), (char)uVar4 != cVar3)) {
        return false;
      }
    }
    idx = idx + 2;
    hexb.m_data = (storage_type_conflict *)((long)hexb.m_data + 1);
  }
  return false;
}

Assistant:

bool match(const QByteArray& data, const QString& pattern) {
    for(qint64 i = 0, idx = 0; (i <= (pattern.size() - 2)); i += 2, idx++) {
        if(idx >= data.size())
            return false;

#if QT_VERSION >= QT_VERSION_CHECK(6, 0, 0)
        QStringView hexb = QStringView{pattern}.mid(i, 2);
#else
        const QStringRef& hexb = pattern.midRef(i, 2);
#endif

        if(hexb == *WILDCARD_BYTE)
            continue;

        bool ok = false;
        auto b = static_cast<char>(hexb.toUInt(&ok, 16));
        if(!ok || (b != data.at(idx)))
            return false;
    }

    return true;
}